

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void btreeParseCellPtrIndex(MemPage *pPage,u8 *pCell,CellInfo *pInfo)

{
  byte *pbVar1;
  byte *pbVar2;
  bool local_39;
  u8 *pEnd;
  byte *pbStack_28;
  u32 nPayload;
  u8 *pIter;
  CellInfo *pInfo_local;
  u8 *pCell_local;
  MemPage *pPage_local;
  
  pbVar1 = pCell + (int)(uint)pPage->childPtrSize;
  pEnd._4_4_ = (uint)*pbVar1;
  pbStack_28 = pbVar1;
  if (0x7f < pEnd._4_4_) {
    pEnd._4_4_ = pEnd._4_4_ & 0x7f;
    do {
      pbVar2 = pbStack_28 + 1;
      pEnd._4_4_ = pEnd._4_4_ << 7 | pbStack_28[1] & 0x7f;
      local_39 = 0x7f < *pbVar2 && pbVar2 < pbVar1 + 8;
      pbStack_28 = pbVar2;
    } while (local_39);
  }
  pInfo->nKey = (ulong)pEnd._4_4_;
  pInfo->nPayload = pEnd._4_4_;
  pInfo->pPayload = pbStack_28 + 1;
  if (pPage->maxLocal < pEnd._4_4_) {
    btreeParseCellAdjustSizeForOverflow(pPage,pCell,pInfo);
  }
  else {
    pInfo->nSize = (u16)pEnd._4_4_ + ((short)(pbStack_28 + 1) - (short)pCell);
    if (pInfo->nSize < 4) {
      pInfo->nSize = 4;
    }
    pInfo->nLocal = (u16)pEnd._4_4_;
  }
  return;
}

Assistant:

static void btreeParseCellPtrIndex(
  MemPage *pPage,         /* Page containing the cell */
  u8 *pCell,              /* Pointer to the cell text. */
  CellInfo *pInfo         /* Fill in this structure */
){
  u8 *pIter;              /* For scanning through pCell */
  u32 nPayload;           /* Number of bytes of cell payload */

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->leaf==0 || pPage->leaf==1 );
  assert( pPage->intKeyLeaf==0 );
  pIter = pCell + pPage->childPtrSize;
  nPayload = *pIter;
  if( nPayload>=0x80 ){
    u8 *pEnd = &pIter[8];
    nPayload &= 0x7f;
    do{
      nPayload = (nPayload<<7) | (*++pIter & 0x7f);
    }while( *(pIter)>=0x80 && pIter<pEnd );
  }
  pIter++;
  pInfo->nKey = nPayload;
  pInfo->nPayload = nPayload;
  pInfo->pPayload = pIter;
  testcase( nPayload==pPage->maxLocal );
  testcase( nPayload==pPage->maxLocal+1 );
  if( nPayload<=pPage->maxLocal ){
    /* This is the (easy) common case where the entire payload fits
    ** on the local page.  No overflow is required.
    */
    pInfo->nSize = nPayload + (u16)(pIter - pCell);
    if( pInfo->nSize<4 ) pInfo->nSize = 4;
    pInfo->nLocal = (u16)nPayload;
  }else{
    btreeParseCellAdjustSizeForOverflow(pPage, pCell, pInfo);
  }
}